

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

void Cba_ManWriteFonRange(Cba_Ntk_t *p,int iFon)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Str_t *p_00;
  
  if (iFon < 1) {
    return;
  }
  p_00 = &p->pDesign->vOut;
  iVar3 = Cba_FonRangeSize(p,iFon);
  if (iVar3 == 1) {
    if ((p->vFonRange).nSize < 1) {
      return;
    }
    uVar4 = Vec_IntGetEntry(&p->vFonRange,iFon);
    if ((int)uVar4 < 0) goto LAB_0034ea11;
    if (uVar4 < 2) {
      return;
    }
    pVVar1 = p->pDesign->vHash->vObjs;
    uVar4 = uVar4 * 2 & 0xfffffffc;
    if (pVVar1->nSize <= (int)uVar4) goto LAB_0034ea4f;
    if (pVVar1->pArray[(ulong)uVar4 + 1] == 0) {
      return;
    }
  }
  uVar4 = 0;
  if ((p->vFonRange).nSize < 1) {
    uVar6 = 0;
    goto LAB_0034e9ec;
  }
  pVVar1 = &p->vFonRange;
  uVar4 = Vec_IntGetEntry(pVVar1,iFon);
  if ((int)uVar4 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10d,"int Abc_LitIsCompl(int)");
  }
  if ((uVar4 & 1) != 0) {
    Vec_StrPrintF(p_00,"signed ");
  }
  uVar6 = 0;
  uVar4 = 0;
  if ((p->vFonRange).nSize < 1) goto LAB_0034e9ec;
  uVar5 = Vec_IntGetEntry(pVVar1,iFon);
  if ((int)uVar5 < 0) {
LAB_0034ea11:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  uVar6 = 0;
  uVar4 = 0;
  if (1 < uVar5) {
    pVVar2 = p->pDesign->vHash->vObjs;
    uVar4 = uVar5 * 2 & 0xfffffffc;
    if (pVVar2->nSize <= (int)uVar4) goto LAB_0034ea4f;
    uVar4 = pVVar2->pArray[uVar4];
  }
  if (0 < (p->vFonRange).nSize) {
    uVar5 = Vec_IntGetEntry(pVVar1,iFon);
    if ((int)uVar5 < 0) goto LAB_0034ea11;
    if (1 < uVar5) {
      pVVar1 = p->pDesign->vHash->vObjs;
      uVar6 = uVar5 * 2 & 0xfffffffc;
      if (pVVar1->nSize <= (int)uVar6) {
LAB_0034ea4f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar6 = pVVar1->pArray[(ulong)uVar6 + 1];
    }
  }
LAB_0034e9ec:
  Vec_StrPrintF(p_00,"[%d:%d] ",(ulong)uVar4,(ulong)uVar6);
  return;
}

Assistant:

void Cba_ManWriteFonRange( Cba_Ntk_t * p, int iFon )
{
    Vec_Str_t * vStr = &p->pDesign->vOut;
    if ( !iFon || Cba_FonIsConst(iFon) || (Cba_FonRangeSize(p, iFon) == 1 && Cba_FonRight(p, iFon) == 0) )
        return;
    if ( Cba_FonSigned(p, iFon) )
        Vec_StrPrintF( vStr, "signed " );
    Vec_StrPrintF( vStr, "[%d:%d] ", Cba_FonLeft(p, iFon), Cba_FonRight(p, iFon) );
}